

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AssignEvaluator.h
# Opt level: O0

void Eigen::internal::
     resize_if_allowed<Eigen::Matrix<double,1,2,1,1,2>,Eigen::Block<Eigen::Matrix<double,_1,2,1,_1,2>const,1,2,true>,double,double>
               (Matrix<double,_1,_2,_1,_1,_2> *dst,
               Block<const_Eigen::Matrix<double,__1,_2,_1,__1,_2>,_1,_2,_true> *src,
               assign_op<double,_double> *param_3)

{
  Index IVar1;
  Index cols;
  Index IVar2;
  bool bVar3;
  Index dstCols;
  Index dstRows;
  assign_op<double,_double> *param_2_local;
  Block<const_Eigen::Matrix<double,__1,_2,_1,__1,_2>,_1,_2,_true> *src_local;
  Matrix<double,_1,_2,_1,_1,_2> *dst_local;
  
  IVar1 = MapBase<Eigen::Block<const_Eigen::Matrix<double,_-1,_2,_1,_-1,_2>,_1,_2,_true>,_0>::rows
                    ((MapBase<Eigen::Block<const_Eigen::Matrix<double,__1,_2,_1,__1,_2>,_1,_2,_true>,_0>
                      *)src);
  cols = MapBase<Eigen::Block<const_Eigen::Matrix<double,_-1,_2,_1,_-1,_2>,_1,_2,_true>,_0>::cols
                   ((MapBase<Eigen::Block<const_Eigen::Matrix<double,__1,_2,_1,__1,_2>,_1,_2,_true>,_0>
                     *)src);
  IVar2 = PlainObjectBase<Eigen::Matrix<double,_1,_2,_1,_1,_2>_>::rows
                    (&dst->super_PlainObjectBase<Eigen::Matrix<double,_1,_2,_1,_1,_2>_>);
  if (IVar2 == IVar1) {
    IVar2 = PlainObjectBase<Eigen::Matrix<double,_1,_2,_1,_1,_2>_>::cols
                      (&dst->super_PlainObjectBase<Eigen::Matrix<double,_1,_2,_1,_1,_2>_>);
    if (IVar2 == cols) goto LAB_0032aaad;
  }
  PlainObjectBase<Eigen::Matrix<double,_1,_2,_1,_1,_2>_>::resize
            (&dst->super_PlainObjectBase<Eigen::Matrix<double,_1,_2,_1,_1,_2>_>,IVar1,cols);
LAB_0032aaad:
  IVar2 = PlainObjectBase<Eigen::Matrix<double,_1,_2,_1,_1,_2>_>::rows
                    (&dst->super_PlainObjectBase<Eigen::Matrix<double,_1,_2,_1,_1,_2>_>);
  bVar3 = false;
  if (IVar2 == IVar1) {
    IVar1 = PlainObjectBase<Eigen::Matrix<double,_1,_2,_1,_1,_2>_>::cols
                      (&dst->super_PlainObjectBase<Eigen::Matrix<double,_1,_2,_1,_1,_2>_>);
    bVar3 = IVar1 == cols;
  }
  if (!bVar3) {
    __assert_fail("dst.rows() == dstRows && dst.cols() == dstCols",
                  "/workspace/llm4binary/github/license_c_cmakelists/oberbichler[P]ANurbs/external_libraries/Eigen/src/Core/AssignEvaluator.h"
                  ,0x2d1,
                  "void Eigen::internal::resize_if_allowed(DstXprType &, const SrcXprType &, const internal::assign_op<T1, T2> &) [DstXprType = Eigen::Matrix<double, 1, 2>, SrcXprType = Eigen::Block<const Eigen::Matrix<double, -1, 2>, 1, 2, true>, T1 = double, T2 = double]"
                 );
  }
  return;
}

Assistant:

EIGEN_DEVICE_FUNC EIGEN_STRONG_INLINE
void resize_if_allowed(DstXprType &dst, const SrcXprType& src, const internal::assign_op<T1,T2> &/*func*/)
{
  Index dstRows = src.rows();
  Index dstCols = src.cols();
  if(((dst.rows()!=dstRows) || (dst.cols()!=dstCols)))
    dst.resize(dstRows, dstCols);
  eigen_assert(dst.rows() == dstRows && dst.cols() == dstCols);
}